

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O3

ixy_device * ixgbe_init(char *pci_addr,uint16_t rx_queues,uint16_t tx_queues)

{
  long *plVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  __uid_t _Var7;
  uint uVar8;
  ixy_device *piVar9;
  char *pcVar10;
  uint *puVar11;
  char *pcVar12;
  void *pvVar13;
  long lVar14;
  ulong uVar15;
  pkt_buf *ppVar16;
  ixy_device *piVar17;
  uint in_ECX;
  ulong uVar18;
  ulong uVar19;
  undefined6 in_register_00000012;
  long extraout_RDX;
  long extraout_RDX_00;
  int iVar20;
  mempool *pmVar21;
  long *plVar22;
  ulong *puVar23;
  int iVar24;
  undefined6 in_register_00000032;
  uint *puVar25;
  uint uVar26;
  mempool *mempool;
  uint uVar27;
  ixgbe_device *dev;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  dma_memory dVar32;
  uint local_88;
  
  iVar20 = (int)CONCAT62(in_register_00000032,rx_queues);
  pmVar21 = (mempool *)(CONCAT62(in_register_00000012,tx_queues) & 0xffffffff);
  _Var7 = getuid();
  if (_Var7 != 0) {
    ixgbe_init_cold_1();
  }
  if (rx_queues < 0x41) {
    if ((ushort)pmVar21 < 0x41) {
      piVar9 = (ixy_device *)malloc(0x58);
      pcVar10 = strdup(pci_addr);
      piVar9->pci_addr = pcVar10;
      piVar9->driver_name = driver_name;
      piVar9->num_rx_queues = rx_queues;
      piVar9->num_tx_queues = (ushort)pmVar21;
      piVar9->rx_batch = ixgbe_rx_batch;
      piVar9->tx_batch = ixgbe_tx_batch;
      piVar9->read_stats = ixgbe_read_stats;
      piVar9->set_promisc = ixgbe_set_promisc;
      piVar9->get_link_speed = ixgbe_get_link_speed;
      puVar11 = (uint *)pci_map_resource(pci_addr);
      piVar9[1].pci_addr = (char *)puVar11;
      pcVar12 = (char *)calloc((ulong)rx_queues,0x8018);
      piVar9[1].driver_name = pcVar12;
      pvVar13 = calloc((ulong)tx_queues,0x8010);
      *(void **)&piVar9[1].num_rx_queues = pvVar13;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Resetting device %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xe2,"reset_and_init",pcVar10);
      puVar11[0x222] = 0x7fffffff;
      *puVar11 = 0x4000008;
      if ((*puVar11 & 0x4000008) != 0) {
        ixgbe_init_cold_2();
      }
      usleep(10000);
      puVar11[0x222] = 0x7fffffff;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Initializing device %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xee,"reset_and_init",pcVar10);
      if ((puVar11[0x4004] >> 9 & 1) == 0) {
        ixgbe_init_cold_3();
      }
      if ((puVar11[0xbc0] & 8) == 0) {
        ixgbe_init_cold_4();
      }
      puVar11[0x10a8] = puVar11[0x10a8] & 0xffff1fff | 0x6000;
      puVar11[0x10a8] = puVar11[0x10a8] & 0xfffffe7f;
      puVar11[0x10a8] = puVar11[0x10a8] | 0x1000;
      puVar11[0xc00] = puVar11[0xc00] & 0xfffffffe;
      puVar11[0xf00] = 0x20000;
      lVar14 = 0xf01;
      do {
        puVar11[lVar14] = 0;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xf08);
      puVar11[0x1090] = puVar11[0x1090] | 2;
      puVar11[0xbc0] = puVar11[0xbc0] | 2;
      puVar11[0x1420] = puVar11[0x1420] | 0x400;
      if (rx_queues == 0) {
        puVar11[6] = puVar11[6] | 0x10000;
      }
      else {
        pcVar12 = pcVar12 + 0x12;
        uVar27 = 0x2100;
        local_88 = 0;
        uVar29 = 0;
        do {
          fprintf(_stderr,"[DEBUG] %s:%d %s(): initializing rx queue %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                  ,0x7d,"init_rx",uVar29 & 0xffffffff);
          uVar8 = uVar27;
          if (0xf < uVar29) {
            uVar8 = (int)uVar29 * 0x40;
            if (uVar29 < 0x40) {
              uVar8 = uVar8 | 0x1014;
            }
            else {
              uVar8 = uVar8 + 0xc014;
            }
          }
          *(uint *)((long)puVar11 + (ulong)uVar8) =
               *(uint *)((long)puVar11 + (ulong)uVar8) & 0xf1ffffff | 0x2000000;
          uVar31 = local_88;
          uVar8 = uVar27;
          if (0xf < uVar29) {
            uVar31 = (int)uVar29 * 0x40;
            if (uVar29 < 0x40) {
              uVar8 = uVar31 | 0x1014;
            }
            else {
              uVar8 = uVar31 + 0xc014;
            }
          }
          uVar26 = uVar31 + 0xc018;
          if (uVar29 < 0x40) {
            uVar26 = uVar31 | 0x1018;
          }
          uVar3 = uVar31 + 0xc010;
          if (uVar29 < 0x40) {
            uVar3 = uVar31 | 0x1010;
          }
          uVar4 = uVar31 + 0xc008;
          if (uVar29 < 0x40) {
            uVar4 = uVar31 | 0x1008;
          }
          uVar5 = uVar31 + 0xc004;
          if (uVar29 < 0x40) {
            uVar5 = uVar31 | 0x1004;
          }
          uVar2 = uVar31 + 0xc000;
          if (uVar29 < 0x40) {
            uVar2 = uVar31 | 0x1000;
          }
          *(uint *)((long)puVar11 + (ulong)uVar8) =
               *(uint *)((long)puVar11 + (ulong)uVar8) | 0x10000000;
          dVar32 = memory_allocate_dma(0x2000,true);
          pvVar13 = dVar32.virt;
          memset(pvVar13,0xff,0x2000);
          *(int *)((long)puVar11 + (ulong)uVar2) = (int)dVar32.phy;
          *(int *)((long)puVar11 + (ulong)uVar5) = dVar32.phy._4_4_;
          *(undefined4 *)((long)puVar11 + (ulong)uVar4) = 0x2000;
          fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d phy addr:  0x%012lX\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                  ,0x8b,"init_rx",uVar29 & 0xffffffff,dVar32.phy);
          fprintf(_stderr,"[DEBUG] %s:%d %s(): rx ring %d virt addr: 0x%012lX\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
                  ,0x8c,"init_rx",uVar29 & 0xffffffff,pvVar13);
          *(undefined4 *)((long)puVar11 + (ulong)uVar3) = 0;
          *(undefined4 *)((long)puVar11 + (ulong)uVar26) = 0;
          pcVar12[-2] = '\0';
          pcVar12[-1] = '\x02';
          pcVar12[0] = '\0';
          pcVar12[1] = '\0';
          *(void **)(pcVar12 + -0x12) = pvVar13;
          uVar29 = uVar29 + 1;
          pcVar12 = pcVar12 + 0x18;
          uVar27 = uVar27 + 4;
          local_88 = local_88 + 0x40;
        } while (uVar29 < rx_queues);
        puVar11[6] = puVar11[6] | 0x10000;
        if (rx_queues != 0) {
          uVar27 = 0;
          uVar8 = 0x2200;
          do {
            uVar31 = uVar8;
            if (0xf < uVar27) {
              if (uVar27 < 0x40) {
                uVar31 = uVar27 * 0x40 | 0x100c;
              }
              else {
                uVar31 = uVar27 * 0x40 + 0xc00c;
              }
            }
            *(uint *)((long)puVar11 + (ulong)uVar31) =
                 *(uint *)((long)puVar11 + (ulong)uVar31) & 0xffffefff;
            uVar27 = uVar27 + 1;
            uVar8 = uVar8 + 4;
          } while (rx_queues != uVar27);
        }
      }
      puVar11[0xc00] = puVar11[0xc00] | 1;
      puVar11[0x1090] = puVar11[0x1090] | 0x401;
      puVar11[0x3300] = 0xa000;
      lVar14 = 0x3301;
      do {
        puVar11[lVar14] = 0;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x3308);
      puVar11[0x2040] = 0xffff;
      puVar11[0x1240] = puVar11[0x1240] & 0xffffffbf;
      if (tx_queues != 0) {
        ixgbe_init_cold_5();
      }
      puVar11[0x12a0] = 1;
      if (rx_queues != 0) {
        ixgbe_init_cold_6();
      }
      if (tx_queues != 0) {
        ixgbe_init_cold_7();
      }
      fprintf(_stdout,"[INFO ] %s:%d %s(): enabling promisc mode\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0x143,"ixgbe_set_promisc");
      puVar11[0x1420] = puVar11[0x1420] | 0x300;
      fprintf(_stdout,"[INFO ] %s:%d %s(): Waiting for link...\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xd4,"wait_for_link");
      for (iVar20 = 10000000;
          (((puVar11[0x10a9] >> 0x1e & 1) == 0 || ((puVar11[0x10a9] & 0x30000000) == 0)) &&
          (0 < iVar20)); iVar20 = iVar20 + -100000) {
        usleep(100000);
      }
      uVar29 = 0;
      if ((puVar11[0x10a9] >> 0x1e & 1) != 0) {
        uVar29 = (ulong)*(uint *)(&DAT_001067b8 + (puVar11[0x10a9] >> 0x1a & 0xc));
      }
      fprintf(_stdout,"[INFO ] %s:%d %s(): Link speed is %d Mbit/s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/Yumasi[P]ixy-vswitch/extern/ixy/src/driver/ixgbe.c"
              ,0xdc,"wait_for_link",uVar29);
      return piVar9;
    }
  }
  else {
    ixgbe_init_cold_9();
  }
  ixgbe_init_cold_8();
  if (in_ECX == 0) {
    uVar29 = 0;
  }
  else {
    puVar23 = (ulong *)((ulong)(uint)(iVar20 * 0x18) + (long)pmVar21[3].base_addr);
    uVar6 = *(ushort *)((long)puVar23 + 0x12);
    uVar15 = (ulong)uVar6;
    uVar29 = *puVar23;
    lVar14 = (ulong)uVar6 * 0x10;
    uVar27 = *(uint *)(uVar29 + 8 + lVar14);
    if ((uVar27 & 1) == 0) {
      uVar8 = (uint)uVar6;
      uVar29 = 0;
    }
    else {
      plVar22 = (long *)(uVar29 + lVar14);
      puVar11 = (uint *)(uVar29 + lVar14 + 8);
      uVar18 = (ulong)in_ECX - 1;
      uVar28 = 0;
      uVar19 = uVar18;
      mempool = pmVar21;
      uVar30 = uVar15;
      do {
        uVar8 = (uint)uVar15;
        uVar31 = (uint)uVar19;
        if ((uVar27 & 2) == 0) {
          ixgbe_rx_batch_cold_2();
          iVar24 = (int)puVar11;
LAB_00104291:
          ixgbe_rx_batch_cold_1();
          lVar14 = *(long *)&mempool[3].buf_size;
          uVar15 = (ulong)(uint)(iVar24 << 4);
          plVar22 = (long *)(lVar14 + uVar15);
          uVar29 = (ulong)*(ushort *)(lVar14 + 10 + uVar15);
          uVar6 = *(ushort *)(lVar14 + 0xc + uVar15);
          goto LAB_001042e0;
        }
        uVar31 = (uint)*(ushort *)((long)plVar22 + 0xe);
        uVar29 = puVar23[uVar30 + 3];
        *(uint *)(uVar29 + 0x14) = (uint)*(ushort *)((long)plVar22 + 0xc);
        mempool = (mempool *)puVar23[1];
        puVar25 = puVar11;
        ppVar16 = pkt_buf_alloc(mempool);
        iVar24 = (int)puVar25;
        if (ppVar16 == (pkt_buf *)0x0) goto LAB_00104291;
        *plVar22 = ppVar16->buf_addr_phy + 0x40;
        puVar11[0] = 0;
        puVar11[1] = 0;
        puVar23[uVar30 + 3] = (ulong)ppVar16;
        *(ulong *)(extraout_RDX + uVar28 * 8) = uVar29;
        uVar27 = (int)puVar23[2] - 1U & uVar8 + 1;
        uVar15 = (ulong)uVar27;
        uVar6 = (ushort)uVar27;
        uVar29 = (ulong)in_ECX;
        if (uVar18 == uVar28) break;
        uVar19 = *puVar23;
        uVar30 = (ulong)uVar6;
        uVar29 = (ulong)((uVar27 & 0xffff) << 4);
        plVar22 = (long *)(uVar19 + uVar29);
        puVar11 = (uint *)(uVar19 + uVar29 + 8);
        uVar27 = *puVar11;
        uVar28 = uVar28 + 1;
        uVar29 = uVar28;
      } while ((uVar27 & 1) != 0);
    }
    if (uVar6 != (ushort)uVar8) {
      uVar27 = iVar20 * 0x40 + 0xc018;
      if ((ushort)iVar20 < 0x40) {
        uVar27 = iVar20 * 0x40 | 0x1018;
      }
      *(uint *)(*(long *)&pmVar21[2].free_stack_top + (ulong)uVar27) = uVar8 & 0xffff;
      *(ushort *)((long)puVar23 + 0x12) = uVar6;
    }
  }
  return (ixy_device *)(uVar29 & 0xffffffff);
LAB_001042e0:
  uVar15 = uVar29 & 0xffff;
  uVar27 = (uint)uVar15;
  iVar20 = uVar6 - uVar27;
  if (iVar20 < 0) {
    iVar20 = iVar20 + (uint)*(ushort *)(plVar22 + 1);
  }
  if (iVar20 < 0x20) goto LAB_0010435f;
  uVar8 = (uint)*(ushort *)(plVar22 + 1);
  if (uVar27 + 0x1f < uVar8) {
    uVar8 = 0;
  }
  uVar8 = (uVar27 + 0x1f) - uVar8;
  if ((*(uint *)(*plVar22 + 0xc + (long)(int)uVar8 * 0x10) & 1) == 0) goto LAB_0010435f;
  pkt_buf_free((pkt_buf *)plVar22[uVar15 + 2]);
  while (uVar8 != uVar27) {
    uVar27 = (int)plVar22[1] - 1U & (int)uVar15 + 1U & 0xffff;
    uVar15 = (ulong)uVar27;
    pkt_buf_free((pkt_buf *)plVar22[uVar15 + 2]);
  }
  uVar29 = (ulong)((int)plVar22[1] - 1U & uVar8 + 1);
  goto LAB_001042e0;
LAB_0010435f:
  *(short *)((long)plVar22 + 10) = (short)uVar29;
  if (uVar31 == 0) {
    piVar9 = (ixy_device *)0x0;
  }
  else {
    piVar17 = (ixy_device *)0x0;
    uVar27 = (uint)uVar6;
    do {
      uVar26 = (int)plVar22[1] - 1;
      uVar8 = uVar27 + 1 & uVar26;
      piVar9 = piVar17;
      if ((short)uVar29 == (short)uVar8) break;
      plVar1 = *(long **)(extraout_RDX_00 + (long)piVar17 * 8);
      plVar22[(ulong)(uVar27 & 0xffff) + 2] = (long)plVar1;
      *(ushort *)((long)plVar22 + 0xc) =
           (ushort)uVar26 & (short)*(undefined4 *)((long)plVar22 + 0xc) + 1U;
      lVar14 = *plVar22;
      uVar15 = (ulong)((uVar27 & 0xffff) << 4);
      *(long *)(lVar14 + uVar15) = *plVar1 + 0x40;
      *(uint *)(lVar14 + 8 + uVar15) = *(uint *)((long)plVar1 + 0x14) | 0x2b300000;
      *(int *)(lVar14 + 0xc + uVar15) = *(int *)((long)plVar1 + 0x14) << 0xe;
      piVar17 = (ixy_device *)((long)&piVar17->pci_addr + 1);
      piVar9 = (ixy_device *)(ulong)uVar31;
      uVar27 = uVar8;
    } while ((ixy_device *)(ulong)uVar31 != piVar17);
  }
  *(uint *)(*(long *)&mempool[2].free_stack_top + 0x6018 + (ulong)(uint)(iVar24 << 6)) =
       (uint)*(ushort *)((long)plVar22 + 0xc);
  return piVar9;
}

Assistant:

struct ixy_device* ixgbe_init(const char* pci_addr, uint16_t rx_queues, uint16_t tx_queues) {
	if (getuid()) {
		warn("Not running as root, this will probably fail");
	}
	if (rx_queues > MAX_QUEUES) {
		error("cannot configure %d rx queues: limit is %d", rx_queues, MAX_QUEUES);
	}
	if (tx_queues > MAX_QUEUES) {
		error("cannot configure %d tx queues: limit is %d", tx_queues, MAX_QUEUES);
	}
	struct ixgbe_device* dev = (struct ixgbe_device*) malloc(sizeof(struct ixgbe_device));
	dev->ixy.pci_addr = strdup(pci_addr);
	dev->ixy.driver_name = driver_name;
	dev->ixy.num_rx_queues = rx_queues;
	dev->ixy.num_tx_queues = tx_queues;
	dev->ixy.rx_batch = ixgbe_rx_batch;
	dev->ixy.tx_batch = ixgbe_tx_batch;
	dev->ixy.read_stats = ixgbe_read_stats;
	dev->ixy.set_promisc = ixgbe_set_promisc;
	dev->ixy.get_link_speed = ixgbe_get_link_speed;
	dev->addr = pci_map_resource(pci_addr);
	dev->rx_queues = calloc(rx_queues, sizeof(struct ixgbe_rx_queue) + sizeof(void*) * MAX_RX_QUEUE_ENTRIES);
	dev->tx_queues = calloc(tx_queues, sizeof(struct ixgbe_tx_queue) + sizeof(void*) * MAX_TX_QUEUE_ENTRIES);
	reset_and_init(dev);
	return &dev->ixy;
}